

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall happly::TypedProperty<short>::readNext(TypedProperty<short> *this,istream *stream)

{
  iterator __position;
  
  __position._M_current =
       (this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    geometrycentral::surface::std::vector<short,_std::allocator<short>_>::_M_realloc_insert<>
              (&this->data,__position);
  }
  else {
    *__position._M_current = 0;
    (this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  std::istream::read((char *)stream,
                     (long)((this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_finish + -1));
  return;
}

Assistant:

virtual void readNext(std::istream& stream) override {
    data.emplace_back();
    stream.read((char*)&data.back(), sizeof(T));
  }